

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcaf_grammar_and(int n,mpc_val_t **xs)

{
  mpc_parser_t *local_28;
  mpc_parser_t *p;
  int i;
  mpc_val_t **xs_local;
  int n_local;
  
  local_28 = mpc_pass();
  for (p._4_4_ = 0; p._4_4_ < n; p._4_4_ = p._4_4_ + 1) {
    if (xs[p._4_4_] != (mpc_val_t *)0x0) {
      local_28 = mpca_and(2,local_28,xs[p._4_4_]);
    }
  }
  return local_28;
}

Assistant:

static mpc_val_t *mpcaf_grammar_and(int n, mpc_val_t **xs) {
  int i;
  mpc_parser_t *p = mpc_pass();
  for (i = 0; i < n; i++) {
    if (xs[i] != NULL) { p = mpca_and(2, p, xs[i]); }
  }
  return p;
}